

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseLinear2D<0UL>::PiecewiseLinear2D
          (void *param_1,undefined8 param_2,long param_3,int param_4,int param_5,byte param_6,
          byte param_7)

{
  float *__src;
  uint uVar1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this;
  int *piVar2;
  reference this_00;
  pointer __dest;
  float **ppfVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint32_t k;
  float avg;
  float v11;
  float v01;
  float v10;
  float v00;
  uint32_t x_1;
  size_t i_6;
  uint32_t y_2;
  double sum_2;
  float normalization_1;
  uint32_t slice_1;
  float *data_out_1;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  float normalization;
  int y_1;
  double sum;
  int x;
  size_t i_2;
  double sum_1;
  int y;
  uint32_t slice;
  float *data_out;
  float *conditional_cdf;
  float *marginal_cdf;
  uint32_t n_values;
  int i_1;
  int i;
  uint32_t slices;
  float in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd18;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffd20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffd28;
  uint local_294;
  int *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdb0;
  int line;
  char *in_stack_fffffffffffffdb8;
  uint local_1cc;
  uint local_1b4;
  ulong local_1b0;
  uint local_1a4;
  double local_1a0;
  float local_198;
  uint local_194;
  pointer local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  int local_16c;
  double local_168;
  int local_15c;
  long local_158;
  double local_150;
  int local_148;
  uint local_144;
  pointer local_140;
  pointer local_138;
  pointer local_130;
  int local_7c;
  uint local_74;
  polymorphic_allocator<float> local_70;
  polymorphic_allocator<float> local_68 [3];
  polymorphic_allocator<float> local_50;
  polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_> local_48 [2]
  ;
  Tuple2<pbrt::Vector2,_int> local_34;
  byte local_2a;
  byte local_29;
  int local_28;
  int local_24;
  long local_20;
  void *local_18;
  array<const_float_*,_0> local_a;
  array<int,_0> local_9;
  undefined8 local_8;
  
  local_29 = param_6 & 1;
  local_2a = param_7 & 1;
  local_28 = param_5;
  local_24 = param_4;
  local_20 = param_3;
  local_18 = param_1;
  local_8 = param_2;
  Vector2<int>::Vector2
            ((Vector2<int> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (int)in_stack_fffffffffffffd0c,(int)in_stack_fffffffffffffd08);
  Vector2<float>::Vector2
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
  Vector2<int>::Vector2
            ((Vector2<int> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (int)in_stack_fffffffffffffd0c,(int)in_stack_fffffffffffffd08);
  local_34 = (Tuple2<pbrt::Vector2,_int>)
             Tuple2<pbrt::Vector2,int>::operator-
                       ((Tuple2<pbrt::Vector2,_int> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        (Vector2<int> *)0x69b4a4);
  Vector2<float>::Vector2<int>
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (Vector2<int> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
              *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  pstd::
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  ::vector((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
            *)((long)param_1 + 0x18),local_48);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&in_stack_fffffffffffffd20->alloc,in_stack_fffffffffffffd18);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)((long)param_1 + 0x38),
             &local_50);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&in_stack_fffffffffffffd20->alloc,in_stack_fffffffffffffd18);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)((long)param_1 + 0x58),
             local_68);
  this = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)((long)param_1 + 0x78);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (&in_stack_fffffffffffffd20->alloc,in_stack_fffffffffffffd18);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(this,&local_70);
  if (((local_2a & 1) != 0) && ((local_29 & 1) == 0)) {
    LogFatal((LogLevel)((ulong)this >> 0x20),in_stack_fffffffffffffdb8,
             (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(char *)in_stack_fffffffffffffda8);
  }
  local_74 = 1;
  local_7c = -1;
  while( true ) {
    line = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    if (local_7c < 0) {
      uVar1 = local_24 * local_28;
      pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                ((polymorphic_allocator<float> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
                 (polymorphic_allocator<float> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      if ((local_2a & 1) == 0) {
        local_190 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               ((long)param_1 + 0x38));
        for (local_194 = 0; local_194 < local_74; local_194 = local_194 + 1) {
          local_198 = HProd<pbrt::Vector2,float>
                                ((Tuple2<pbrt::Vector2,_float> *)((long)param_1 + 0x10));
          local_198 = 1.0 / local_198;
          if ((local_29 & 1) != 0) {
            local_1a0 = 0.0;
            for (local_1a4 = 0; local_1a4 < *(int *)((long)param_1 + 4) - 1U;
                local_1a4 = local_1a4 + 1) {
              local_1b0 = (ulong)(local_1a4 * local_24);
              for (local_1b4 = 0; local_1b4 < *param_1 - 1U; local_1b4 = local_1b4 + 1) {
                local_1a0 = (double)((*(float *)(local_20 + local_1b0 * 4) +
                                      *(float *)(local_20 + 4 + local_1b0 * 4) +
                                      *(float *)(local_20 + (local_1b0 + (long)local_24) * 4) +
                                     *(float *)(local_20 + (local_1b0 + 1 + (long)local_24) * 4)) *
                                    0.25) + local_1a0;
                local_1b0 = local_1b0 + 1;
              }
            }
            local_198 = (float)(1.0 / local_1a0);
          }
          for (local_1cc = 0; local_1cc < uVar1; local_1cc = local_1cc + 1) {
            local_190[local_1cc] = *(float *)(local_20 + (ulong)local_1cc * 4) * local_198;
          }
          local_20 = local_20 + (ulong)uVar1 * 4;
          local_190 = local_190 + uVar1;
        }
      }
      else {
        pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                  ((polymorphic_allocator<float> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                  (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
                   (polymorphic_allocator<float> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                  ((polymorphic_allocator<float> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                  (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
                   (polymorphic_allocator<float> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        local_130 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               ((long)param_1 + 0x58));
        local_138 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               ((long)param_1 + 0x78));
        local_140 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               ((long)param_1 + 0x38));
        for (local_144 = 0; local_144 < local_74; local_144 = local_144 + 1) {
          for (local_148 = 0; local_148 < *(int *)((long)param_1 + 4); local_148 = local_148 + 1) {
            local_150 = 0.0;
            local_158 = (long)(local_148 * local_24);
            local_138[local_158] = 0.0;
            for (local_15c = 0; local_15c < *param_1 + -1; local_15c = local_15c + 1) {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_150;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = (double)*(float *)(local_20 + local_158 * 4) +
                             (double)*(float *)(local_20 + 4 + local_158 * 4);
              auVar5 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar5,auVar7);
              local_150 = auVar5._0_8_;
              local_138[local_158 + 1] = (float)local_150;
              local_158 = local_158 + 1;
            }
          }
          *local_130 = 0.0;
          local_168 = 0.0;
          for (local_16c = 0; local_16c < *(int *)((long)param_1 + 4) + -1;
              local_16c = local_16c + 1) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_168;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (double)local_138[(local_16c + 1) * local_24 + -1] +
                           (double)local_138[(local_16c + 2) * local_24 + -1];
            auVar5 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar6,auVar8);
            local_168 = auVar5._0_8_;
            local_130[local_16c + 1] = (float)local_168;
          }
          fVar4 = 1.0 / local_130[*(int *)((long)param_1 + 4) + -1];
          for (local_178 = 0; local_178 < uVar1; local_178 = local_178 + 1) {
            local_138[local_178] = fVar4 * local_138[local_178];
          }
          for (local_180 = 0; local_180 < (ulong)(long)*(int *)((long)param_1 + 4);
              local_180 = local_180 + 1) {
            local_130[local_180] = fVar4 * local_130[local_180];
          }
          for (local_188 = 0; local_188 < uVar1; local_188 = local_188 + 1) {
            local_140[local_188] = *(float *)(local_20 + local_188 * 4) * fVar4;
          }
          local_130 = local_130 + *(int *)((long)param_1 + 4);
          local_138 = local_138 + uVar1;
          local_140 = local_140 + uVar1;
          local_20 = local_20 + (ulong)uVar1 * 4;
        }
      }
      return;
    }
    piVar2 = pstd::array<int,_0>::operator[](&local_9,(long)local_7c);
    if (*piVar2 < 1) break;
    in_stack_fffffffffffffdb0 = pstd::array<int,_0>::operator[](&local_9,(long)local_7c);
    *(int *)((long)param_1 + (long)local_7c * 4 + 0x18) = *in_stack_fffffffffffffdb0;
    in_stack_fffffffffffffda8 = pstd::array<int,_0>::operator[](&local_9,(long)local_7c);
    pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
              ((polymorphic_allocator<float> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
              (in_stack_fffffffffffffd20,(size_t)in_stack_fffffffffffffd18,
               (polymorphic_allocator<float> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    pstd::
    vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
    ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                  *)((long)param_1 + 0x18),(long)local_7c);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    this_00 = pstd::
              vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
              ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                            *)((long)param_1 + 0x18),(long)local_7c);
    __dest = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_00);
    ppfVar3 = pstd::array<const_float_*,_0>::operator[](&local_a,(long)local_7c);
    __src = *ppfVar3;
    piVar2 = pstd::array<int,_0>::operator[](&local_9,(long)local_7c);
    memcpy(__dest,__src,(long)*piVar2 << 2);
    piVar2 = pstd::array<int,_0>::operator[](&local_9,(long)local_7c);
    if (*piVar2 < 2) {
      local_294 = 0;
    }
    else {
      local_294 = local_74;
    }
    *(uint *)((long)param_1 + (long)local_7c * 4 + 0x18) = local_294;
    local_74 = *(int *)((long)param_1 + (long)local_7c * 4 + 0x18) * local_74;
    local_7c = local_7c + -1;
  }
  LogFatal((LogLevel)((ulong)this >> 0x20),(char *)piVar2,line,(char *)in_stack_fffffffffffffda8);
}

Assistant:

PiecewiseLinear2D(Allocator alloc, const float *data, int xSize, int ySize,
                      pstd::array<int, Dimension> param_res = {},
                      pstd::array<const float *, Dimension> param_values = {},
                      bool normalize = true, bool build_cdf = true)
        : m_size(xSize, ySize),
          m_patch_size(1.f / (xSize - 1), 1.f / (ySize - 1)),
          m_inv_patch_size(m_size - Vector2i(1, 1)),
          m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        if (build_cdf && !normalize)
            LOG_FATAL("PiecewiseLinear2D: build_cdf implies normalize=true");

        /* Keep track of the dependence on additional parameters (optional) */
        uint32_t slices = 1;
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
        for (int i = (int)Dimension - 1; i >= 0; --i) {
            if (param_res[i] < 1)
                LOG_FATAL("PiecewiseLinear2D(): parameter resolution must be >= 1!");

            m_param_size[i] = param_res[i];
            m_param_values[i] = FloatStorage(param_res[i]);
            memcpy(m_param_values[i].data(), param_values[i],
                   sizeof(float) * param_res[i]);
            m_param_strides[i] = param_res[i] > 1 ? slices : 0;
            slices *= m_param_size[i];
        }

        uint32_t n_values = xSize * ySize;

        m_data = FloatStorage(slices * n_values);

        if (build_cdf) {
            m_marginal_cdf = FloatStorage(slices * m_size.y);
            m_conditional_cdf = FloatStorage(slices * n_values);

            float *marginal_cdf = m_marginal_cdf.data(),
                  *conditional_cdf = m_conditional_cdf.data(), *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                /* Construct conditional CDF */
                for (int y = 0; y < m_size.y; ++y) {
                    double sum = 0.0;
                    size_t i = y * xSize;
                    conditional_cdf[i] = 0.f;
                    for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                        sum += .5 * ((double)data[i] + (double)data[i + 1]);
                        conditional_cdf[i + 1] = (float)sum;
                    }
                }

                /* Construct marginal CDF */
                marginal_cdf[0] = 0.f;
                double sum = 0.0;
                for (int y = 0; y < m_size.y - 1; ++y) {
                    sum += .5 * ((double)conditional_cdf[(y + 1) * xSize - 1] +
                                 (double)conditional_cdf[(y + 2) * xSize - 1]);
                    marginal_cdf[y + 1] = (float)sum;
                }

                /* Normalize CDFs and PDF (if requested) */
                float normalization = 1.f / marginal_cdf[m_size.y - 1];
                for (size_t i = 0; i < n_values; ++i)
                    conditional_cdf[i] *= normalization;
                for (size_t i = 0; i < m_size.y; ++i)
                    marginal_cdf[i] *= normalization;
                for (size_t i = 0; i < n_values; ++i)
                    data_out[i] = data[i] * normalization;

                marginal_cdf += m_size.y;
                conditional_cdf += n_values;
                data_out += n_values;
                data += n_values;
            }
        } else {
            float *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                float normalization = 1.f / HProd(m_inv_patch_size);
                if (normalize) {
                    double sum = 0.0;
                    for (uint32_t y = 0; y < m_size.y - 1; ++y) {
                        size_t i = y * xSize;
                        for (uint32_t x = 0; x < m_size.x - 1; ++x, ++i) {
                            float v00 = data[i], v10 = data[i + 1], v01 = data[i + xSize],
                                  v11 = data[i + 1 + xSize],
                                  avg = .25f * (v00 + v10 + v01 + v11);
                            sum += (double)avg;
                        }
                    }
                    normalization = float(1.0 / sum);
                }

                for (uint32_t k = 0; k < n_values; ++k)
                    data_out[k] = data[k] * normalization;

                data += n_values;
                data_out += n_values;
            }
        }
    }